

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_Editions_Test::
~ParseEditionsTest_Editions_Test(ParseEditionsTest_Editions_Test *this)

{
  ParseEditionsTest_Editions_Test *this_local;
  
  ~ParseEditionsTest_Editions_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, Editions) {
  ExpectParsesTo(
      R"schema(
        edition = "2023";
        message A {
          int32 b = 1;
        })schema",
      "message_type \t {"
      "  name: \"A\""
      "  field {"
      "    name: \"b\""
      "    number: 1"
      "    label: LABEL_OPTIONAL"
      "    type: TYPE_INT32"
      "  }"
      "}"
      "syntax: \"editions\""
      "edition: EDITION_2023\n");
}